

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory_test.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_d900::DerivedSum::clone
          (DerivedSum *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  DerivedSum *this_00;
  
  this_00 = this;
  std::make_shared<(anonymous_namespace)::DerivedSum,int&>((int *)this);
  std::shared_ptr<(anonymous_namespace)::BaseMultiParms>::
  shared_ptr<(anonymous_namespace)::DerivedSum,void>
            ((shared_ptr<(anonymous_namespace)::BaseMultiParms> *)this_00,
             (shared_ptr<(anonymous_namespace)::DerivedSum> *)this);
  iVar1 = (int)this_00;
  std::shared_ptr<(anonymous_namespace)::DerivedSum>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::DerivedSum> *)0x135a45);
  return iVar1;
}

Assistant:

BaseMultiParms::clone_type clone(int a) override { return make_shared<DerivedSum>(a); }